

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O3

void __thiscall
spdlog::logger::logger<std::shared_ptr<spdlog::sinks::sink>const*>
          (logger *this,string *name,shared_ptr<spdlog::sinks::sink> *begin,
          shared_ptr<spdlog::sinks::sink> *end)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  allocator_type local_19;
  
  this->_vptr_logger = (_func_int **)&PTR__logger_00164d38;
  paVar1 = &(this->name_).field_2;
  (this->name_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (name->_M_dataplus)._M_p;
  paVar2 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name_).field_2 + 8) = uVar4;
  }
  else {
    (this->name_)._M_dataplus._M_p = pcVar3;
    (this->name_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->name_)._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar2;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  std::
  vector<std::shared_ptr<spdlog::sinks::sink>,std::allocator<std::shared_ptr<spdlog::sinks::sink>>>
  ::vector<std::shared_ptr<spdlog::sinks::sink>const*,void>
            ((vector<std::shared_ptr<spdlog::sinks::sink>,std::allocator<std::shared_ptr<spdlog::sinks::sink>>>
              *)&this->sinks_,begin,end,&local_19);
  this->level_ = (__atomic_base<int>)0x2;
  this->flush_level_ = (__atomic_base<int>)0x6;
  (this->tracer_).messages_.max_items_ = 0;
  (this->tracer_).messages_.head_ = 0;
  (this->tracer_).messages_.tail_ = 0;
  (this->tracer_).messages_.overrun_counter_ = 0;
  (this->tracer_).messages_.v_.
  super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tracer_).messages_.v_.
  super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tracer_).messages_.v_.
  super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(this->custom_err_handler_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->custom_err_handler_).super__Function_base._M_functor + 8) = 0;
  (this->custom_err_handler_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->custom_err_handler_)._M_invoker = (_Invoker_type)0x0;
  (this->tracer_).mutex_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->tracer_).mutex_.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->tracer_).mutex_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->tracer_).mutex_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)
   ((long)&(this->tracer_).mutex_.super___mutex_base._M_mutex.__data.__list.__prev + 1) = 0;
  *(undefined8 *)
   ((long)&(this->tracer_).mutex_.super___mutex_base._M_mutex.__data.__list.__next + 1) = 0;
  return;
}

Assistant:

logger(std::string name, It begin, It end)
        : name_(std::move(name))
        , sinks_(begin, end)
    {}